

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha-1.c
# Opt level: O1

void sha1_step(sha1_ctxt *ctxt)

{
  anon_union_64_2_c9586734_for_m *paVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  ulong uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  
  uVar2 = *(ushort *)&ctxt->m;
  uVar3 = *(ushort *)((long)&ctxt->m + 2);
  uVar4 = *(ushort *)((long)&ctxt->m + 4);
  uVar5 = *(ushort *)((long)&ctxt->m + 6);
  uVar6 = *(ushort *)((long)&ctxt->m + 8);
  uVar7 = *(ushort *)((long)&ctxt->m + 10);
  uVar8 = *(ushort *)((long)&ctxt->m + 0xc);
  uVar9 = *(ushort *)((long)&ctxt->m + 0xe);
  uVar10 = *(ushort *)((long)&ctxt->m + 0x10);
  uVar11 = *(ushort *)((long)&ctxt->m + 0x12);
  uVar12 = *(ushort *)((long)&ctxt->m + 0x14);
  uVar13 = *(ushort *)((long)&ctxt->m + 0x16);
  uVar14 = *(ushort *)((long)&ctxt->m + 0x18);
  uVar15 = *(ushort *)((long)&ctxt->m + 0x1a);
  uVar16 = *(ushort *)((long)&ctxt->m + 0x1c);
  uVar17 = *(ushort *)((long)&ctxt->m + 0x1e);
  uVar18 = *(ushort *)((long)&ctxt->m + 0x20);
  uVar19 = *(ushort *)((long)&ctxt->m + 0x22);
  uVar20 = *(ushort *)((long)&ctxt->m + 0x24);
  uVar21 = *(ushort *)((long)&ctxt->m + 0x26);
  uVar22 = *(ushort *)((long)&ctxt->m + 0x28);
  uVar23 = *(ushort *)((long)&ctxt->m + 0x2a);
  uVar24 = *(ushort *)((long)&ctxt->m + 0x2c);
  uVar25 = *(ushort *)((long)&ctxt->m + 0x2e);
  uVar26 = *(ushort *)((long)&ctxt->m + 0x30);
  uVar27 = *(ushort *)((long)&ctxt->m + 0x32);
  uVar28 = *(ushort *)((long)&ctxt->m + 0x34);
  uVar29 = *(ushort *)((long)&ctxt->m + 0x36);
  uVar30 = *(ushort *)((long)&ctxt->m + 0x38);
  uVar31 = *(ushort *)((long)&ctxt->m + 0x3a);
  uVar32 = *(ushort *)((long)&ctxt->m + 0x3c);
  uVar33 = *(ushort *)((long)&ctxt->m + 0x3e);
  *(ushort *)&ctxt->m = uVar3 << 8 | uVar3 >> 8;
  *(ushort *)((long)&ctxt->m + 2) = uVar2 << 8 | uVar2 >> 8;
  *(ushort *)((long)&ctxt->m + 4) = uVar5 << 8 | uVar5 >> 8;
  *(ushort *)((long)&ctxt->m + 6) = uVar4 << 8 | uVar4 >> 8;
  *(ushort *)((long)&ctxt->m + 8) = uVar7 << 8 | uVar7 >> 8;
  *(ushort *)((long)&ctxt->m + 10) = uVar6 << 8 | uVar6 >> 8;
  *(ushort *)((long)&ctxt->m + 0xc) = uVar9 << 8 | uVar9 >> 8;
  *(ushort *)((long)&ctxt->m + 0xe) = uVar8 << 8 | uVar8 >> 8;
  *(ushort *)((long)&ctxt->m + 0x10) = uVar11 << 8 | uVar11 >> 8;
  *(ushort *)((long)&ctxt->m + 0x12) = uVar10 << 8 | uVar10 >> 8;
  *(ushort *)((long)&ctxt->m + 0x14) = uVar13 << 8 | uVar13 >> 8;
  *(ushort *)((long)&ctxt->m + 0x16) = uVar12 << 8 | uVar12 >> 8;
  *(ushort *)((long)&ctxt->m + 0x18) = uVar15 << 8 | uVar15 >> 8;
  *(ushort *)((long)&ctxt->m + 0x1a) = uVar14 << 8 | uVar14 >> 8;
  *(ushort *)((long)&ctxt->m + 0x1c) = uVar17 << 8 | uVar17 >> 8;
  *(ushort *)((long)&ctxt->m + 0x1e) = uVar16 << 8 | uVar16 >> 8;
  *(ushort *)((long)&ctxt->m + 0x20) = uVar19 << 8 | uVar19 >> 8;
  *(ushort *)((long)&ctxt->m + 0x22) = uVar18 << 8 | uVar18 >> 8;
  *(ushort *)((long)&ctxt->m + 0x24) = uVar21 << 8 | uVar21 >> 8;
  *(ushort *)((long)&ctxt->m + 0x26) = uVar20 << 8 | uVar20 >> 8;
  *(ushort *)((long)&ctxt->m + 0x28) = uVar23 << 8 | uVar23 >> 8;
  paVar1 = &ctxt->m;
  *(ushort *)((long)&ctxt->m + 0x2a) = uVar22 << 8 | uVar22 >> 8;
  *(ushort *)((long)&ctxt->m + 0x2c) = uVar25 << 8 | uVar25 >> 8;
  *(ushort *)((long)&ctxt->m + 0x2e) = uVar24 << 8 | uVar24 >> 8;
  *(ushort *)((long)&ctxt->m + 0x30) = uVar27 << 8 | uVar27 >> 8;
  *(ushort *)((long)&ctxt->m + 0x32) = uVar26 << 8 | uVar26 >> 8;
  *(ushort *)((long)&ctxt->m + 0x34) = uVar29 << 8 | uVar29 >> 8;
  *(ushort *)((long)&ctxt->m + 0x36) = uVar28 << 8 | uVar28 >> 8;
  *(ushort *)((long)&ctxt->m + 0x38) = uVar31 << 8 | uVar31 >> 8;
  *(ushort *)((long)&ctxt->m + 0x3a) = uVar30 << 8 | uVar30 >> 8;
  *(ushort *)((long)&ctxt->m + 0x3c) = uVar33 << 8 | uVar33 >> 8;
  *(ushort *)((long)&ctxt->m + 0x3e) = uVar32 << 8 | uVar32 >> 8;
  uVar34 = (ctxt->h).b32[0];
  uVar35 = (ctxt->h).b32[1];
  uVar36 = (ctxt->h).b32[2];
  uVar37 = (ctxt->h).b32[3];
  uVar38 = (ctxt->h).b32[4];
  uVar39 = 0;
  uVar42 = uVar36;
  uVar47 = uVar37;
  uVar41 = uVar38;
  uVar43 = uVar34;
  uVar40 = uVar35;
  do {
    uVar45 = uVar43;
    uVar46 = uVar47;
    uVar47 = uVar42;
    uVar42 = (uint)uVar39;
    uVar43 = uVar42 & 0xf;
    if (0xf < uVar39) {
      uVar42 = paVar1->b32[uVar43 ^ 8] ^ paVar1->b32[uVar42 + 0xd & 0xf] ^
               paVar1->b32[uVar42 + 2 & 0xf] ^ paVar1->b32[uVar43];
      paVar1->b32[uVar43] = uVar42 << 1 | (uint)((int)uVar42 < 0);
    }
    uVar43 = paVar1->b32[uVar43] +
             ((uVar47 ^ uVar46) & uVar40 ^ uVar46) + uVar41 + (uVar45 << 5 | uVar45 >> 0x1b) +
             0x5a827999;
    uVar42 = uVar40 << 0x1e | uVar40 >> 2;
    uVar39 = uVar39 + 1;
    uVar41 = uVar46;
    uVar40 = uVar45;
  } while (uVar39 != 0x14);
  uVar39 = 0x14;
  do {
    uVar40 = uVar43;
    uVar41 = uVar47;
    uVar47 = uVar42;
    uVar42 = (uint)uVar39;
    uVar43 = uVar42 & 0xf;
    uVar42 = paVar1->b32[uVar43 ^ 8] ^ paVar1->b32[uVar42 + 0xd & 0xf] ^
             paVar1->b32[uVar42 + 2 & 0xf] ^ paVar1->b32[uVar43];
    uVar42 = uVar42 << 1 | (uint)((int)uVar42 < 0);
    paVar1->b32[uVar43] = uVar42;
    uVar43 = (uVar47 ^ uVar41 ^ uVar45) + uVar46 + (uVar40 << 5 | uVar40 >> 0x1b) + uVar42 +
             _K[uVar39 / 0x14];
    uVar42 = uVar45 << 0x1e | uVar45 >> 2;
    uVar39 = uVar39 + 1;
    uVar46 = uVar41;
    uVar45 = uVar40;
  } while (uVar39 != 0x28);
  uVar39 = 0x28;
  do {
    uVar45 = uVar43;
    uVar46 = uVar47;
    uVar47 = uVar42;
    uVar42 = (uint)uVar39;
    uVar43 = uVar42 & 0xf;
    uVar42 = paVar1->b32[uVar43 ^ 8] ^ paVar1->b32[uVar42 + 0xd & 0xf] ^
             paVar1->b32[uVar42 + 2 & 0xf] ^ paVar1->b32[uVar43];
    uVar42 = uVar42 << 1 | (uint)((int)uVar42 < 0);
    paVar1->b32[uVar43] = uVar42;
    uVar43 = (uVar47 & uVar46 | (uVar47 | uVar46) & uVar40) +
             (uVar45 << 5 | uVar45 >> 0x1b) + uVar41 + uVar42 + _K[uVar39 / 0x14];
    uVar42 = uVar40 << 0x1e | uVar40 >> 2;
    uVar39 = uVar39 + 1;
    uVar41 = uVar46;
    uVar40 = uVar45;
  } while (uVar39 != 0x3c);
  uVar39 = 0x3c;
  do {
    uVar40 = uVar43;
    uVar44 = uVar47;
    uVar47 = uVar42;
    uVar42 = (uint)uVar39;
    uVar41 = uVar42 & 0xf;
    uVar42 = paVar1->b32[uVar41 ^ 8] ^ paVar1->b32[uVar42 + 0xd & 0xf] ^
             paVar1->b32[uVar42 + 2 & 0xf] ^ paVar1->b32[uVar41];
    uVar42 = uVar42 << 1 | (uint)((int)uVar42 < 0);
    paVar1->b32[uVar41] = uVar42;
    uVar43 = (uVar47 ^ uVar44 ^ uVar45) + uVar46 + (uVar40 << 5 | uVar40 >> 0x1b) + uVar42 +
             _K[uVar39 / 0x14];
    uVar42 = uVar45 << 0x1e | uVar45 >> 2;
    uVar39 = uVar39 + 1;
    uVar46 = uVar44;
    uVar45 = uVar40;
  } while (uVar39 != 0x50);
  (ctxt->h).b32[0] = uVar43 + uVar34;
  (ctxt->h).b32[1] = uVar40 + uVar35;
  (ctxt->h).b32[2] = uVar42 + uVar36;
  (ctxt->h).b32[3] = uVar47 + uVar37;
  (ctxt->h).b32[4] = uVar44 + uVar38;
  *(undefined8 *)((long)&ctxt->m + 0x30) = 0;
  *(undefined8 *)((long)&ctxt->m + 0x38) = 0;
  *(undefined8 *)((long)&ctxt->m + 0x20) = 0;
  *(undefined8 *)((long)&ctxt->m + 0x28) = 0;
  *(undefined8 *)((long)&ctxt->m + 0x10) = 0;
  *(undefined8 *)((long)&ctxt->m + 0x18) = 0;
  *(undefined8 *)paVar1 = 0;
  *(undefined8 *)((long)&ctxt->m + 8) = 0;
  return;
}

Assistant:

static void
sha1_step(struct sha1_ctxt *ctxt)
{
	unsigned int	a, b, c, d, e, tmp;
	size_t t, s;

#if BYTE_ORDER == LITTLE_ENDIAN
	struct sha1_ctxt tctxt;

	memcpy(&tctxt.m.b8[0], &ctxt->m.b8[0], 64);
	ctxt->m.b8[0] = tctxt.m.b8[3]; ctxt->m.b8[1] = tctxt.m.b8[2];
	ctxt->m.b8[2] = tctxt.m.b8[1]; ctxt->m.b8[3] = tctxt.m.b8[0];
	ctxt->m.b8[4] = tctxt.m.b8[7]; ctxt->m.b8[5] = tctxt.m.b8[6];
	ctxt->m.b8[6] = tctxt.m.b8[5]; ctxt->m.b8[7] = tctxt.m.b8[4];
	ctxt->m.b8[8] = tctxt.m.b8[11]; ctxt->m.b8[9] = tctxt.m.b8[10];
	ctxt->m.b8[10] = tctxt.m.b8[9]; ctxt->m.b8[11] = tctxt.m.b8[8];
	ctxt->m.b8[12] = tctxt.m.b8[15]; ctxt->m.b8[13] = tctxt.m.b8[14];
	ctxt->m.b8[14] = tctxt.m.b8[13]; ctxt->m.b8[15] = tctxt.m.b8[12];
	ctxt->m.b8[16] = tctxt.m.b8[19]; ctxt->m.b8[17] = tctxt.m.b8[18];
	ctxt->m.b8[18] = tctxt.m.b8[17]; ctxt->m.b8[19] = tctxt.m.b8[16];
	ctxt->m.b8[20] = tctxt.m.b8[23]; ctxt->m.b8[21] = tctxt.m.b8[22];
	ctxt->m.b8[22] = tctxt.m.b8[21]; ctxt->m.b8[23] = tctxt.m.b8[20];
	ctxt->m.b8[24] = tctxt.m.b8[27]; ctxt->m.b8[25] = tctxt.m.b8[26];
	ctxt->m.b8[26] = tctxt.m.b8[25]; ctxt->m.b8[27] = tctxt.m.b8[24];
	ctxt->m.b8[28] = tctxt.m.b8[31]; ctxt->m.b8[29] = tctxt.m.b8[30];
	ctxt->m.b8[30] = tctxt.m.b8[29]; ctxt->m.b8[31] = tctxt.m.b8[28];
	ctxt->m.b8[32] = tctxt.m.b8[35]; ctxt->m.b8[33] = tctxt.m.b8[34];
	ctxt->m.b8[34] = tctxt.m.b8[33]; ctxt->m.b8[35] = tctxt.m.b8[32];
	ctxt->m.b8[36] = tctxt.m.b8[39]; ctxt->m.b8[37] = tctxt.m.b8[38];
	ctxt->m.b8[38] = tctxt.m.b8[37]; ctxt->m.b8[39] = tctxt.m.b8[36];
	ctxt->m.b8[40] = tctxt.m.b8[43]; ctxt->m.b8[41] = tctxt.m.b8[42];
	ctxt->m.b8[42] = tctxt.m.b8[41]; ctxt->m.b8[43] = tctxt.m.b8[40];
	ctxt->m.b8[44] = tctxt.m.b8[47]; ctxt->m.b8[45] = tctxt.m.b8[46];
	ctxt->m.b8[46] = tctxt.m.b8[45]; ctxt->m.b8[47] = tctxt.m.b8[44];
	ctxt->m.b8[48] = tctxt.m.b8[51]; ctxt->m.b8[49] = tctxt.m.b8[50];
	ctxt->m.b8[50] = tctxt.m.b8[49]; ctxt->m.b8[51] = tctxt.m.b8[48];
	ctxt->m.b8[52] = tctxt.m.b8[55]; ctxt->m.b8[53] = tctxt.m.b8[54];
	ctxt->m.b8[54] = tctxt.m.b8[53]; ctxt->m.b8[55] = tctxt.m.b8[52];
	ctxt->m.b8[56] = tctxt.m.b8[59]; ctxt->m.b8[57] = tctxt.m.b8[58];
	ctxt->m.b8[58] = tctxt.m.b8[57]; ctxt->m.b8[59] = tctxt.m.b8[56];
	ctxt->m.b8[60] = tctxt.m.b8[63]; ctxt->m.b8[61] = tctxt.m.b8[62];
	ctxt->m.b8[62] = tctxt.m.b8[61]; ctxt->m.b8[63] = tctxt.m.b8[60];
#endif

	a = H(0); b = H(1); c = H(2); d = H(3); e = H(4);

	for (t = 0; t < 20; t++) {
		s = t & 0x0f;
		if (t >= 16)
			W(s) = S(1, W((s+13) & 0x0f) ^ W((s+8) & 0x0f) ^
							W((s+2) & 0x0f) ^ W(s));

		tmp = S(5, a) + F0(b, c, d) + e + W(s) + K(t);
		e = d; d = c; c = S(30, b); b = a; a = tmp;
	}
	for (t = 20; t < 40; t++) {
		s = t & 0x0f;
		W(s) = S(1, W((s+13) & 0x0f) ^ W((s+8) & 0x0f) ^
							W((s+2) & 0x0f) ^ W(s));
		tmp = S(5, a) + F1(b, c, d) + e + W(s) + K(t);
		e = d; d = c; c = S(30, b); b = a; a = tmp;
	}
	for (t = 40; t < 60; t++) {
		s = t & 0x0f;
		W(s) = S(1, W((s+13) & 0x0f) ^ W((s+8) & 0x0f) ^
							W((s+2) & 0x0f) ^ W(s));
		tmp = S(5, a) + F2(b, c, d) + e + W(s) + K(t);
		e = d; d = c; c = S(30, b); b = a; a = tmp;
	}
	for (t = 60; t < 80; t++) {
		s = t & 0x0f;
		W(s) = S(1, W((s+13) & 0x0f) ^ W((s+8) & 0x0f) ^
							W((s+2) & 0x0f) ^ W(s));
		tmp = S(5, a) + F3(b, c, d) + e + W(s) + K(t);
		e = d; d = c; c = S(30, b); b = a; a = tmp;
	}

	H(0) = H(0) + a;
	H(1) = H(1) + b;
	H(2) = H(2) + c;
	H(3) = H(3) + d;
	H(4) = H(4) + e;

	memset(&ctxt->m.b8[0], 0, 64);
}